

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<int>::push(vec<int> *this)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = this->sz;
  if (uVar2 == this->cap) {
    uVar3 = 2;
    if (1 < uVar2) {
      uVar3 = (ulong)(uVar2 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar3;
    piVar1 = (int *)realloc(this->data,uVar3 << 2);
    this->data = piVar1;
    uVar2 = this->sz;
  }
  else {
    piVar1 = this->data;
  }
  this->sz = uVar2 + 1;
  piVar1[uVar2] = 0;
  return;
}

Assistant:

void push() {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T();
	}